

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParseTree.cpp
# Opt level: O1

SynIfElse * ParseIfElse(ParseContext *ctx,bool forceStaticIf)

{
  Lexeme *begin;
  Lexeme *pLVar1;
  int iVar2;
  SynBase *pSVar3;
  SynVariableDefinition *node;
  undefined4 extraout_var;
  SynBase *this;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  SynIfElse *this_00;
  undefined4 extraout_var_02;
  SynIfElse *this_01;
  undefined7 in_register_00000031;
  bool forceStaticIf_00;
  IntrusiveList<SynVariableDefinition> definitions;
  IntrusiveList<SynVariableDefinition> local_58;
  SynVariableDefinition *local_48;
  SynVariableDefinition *pSStack_40;
  undefined4 extraout_var_03;
  
  begin = ctx->currentLexeme;
  forceStaticIf_00 = true;
  if (((int)CONCAT71(in_register_00000031,forceStaticIf) == 0) &&
     (forceStaticIf_00 = begin->type == lex_at, forceStaticIf_00)) {
    ctx->currentLexeme = begin + 1;
  }
  if (ctx->currentLexeme->type == lex_if) {
    ctx->currentLexeme = ctx->currentLexeme + 1;
    this = (SynBase *)0x0;
    anon_unknown.dwarf_15703::CheckConsume(ctx,lex_oparen,"ERROR: \'(\' not found after \'if\'");
    if (forceStaticIf_00 == false) {
      pLVar1 = ctx->currentLexeme;
      this = (SynBase *)0x0;
      pSVar3 = ParseType(ctx,(bool *)0x0,false);
      if (pSVar3 != (SynBase *)0x0) {
        local_58.head = (SynVariableDefinition *)0x0;
        local_58.tail = (SynVariableDefinition *)0x0;
        node = ParseVariableDefinition(ctx);
        if (node == (SynVariableDefinition *)0x0) {
          ctx->currentLexeme = pLVar1;
          this = (SynBase *)0x0;
        }
        else {
          IntrusiveList<SynVariableDefinition>::push_back(&local_58,node);
          iVar2 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x60);
          this = (SynBase *)CONCAT44(extraout_var,iVar2);
          if (ctx->currentLexeme <= ctx->firstLexeme) goto LAB_001196be;
          local_48 = local_58.head;
          pSStack_40 = local_58.tail;
          SynBase::SynBase(this,0x34,begin,ctx->currentLexeme + -1);
          this->_vptr_SynBase = (_func_int **)&PTR__SynBase_00247b18;
          this[1]._vptr_SynBase = (_func_int **)0x0;
          *(SynBase **)&this[1].typeID = pSVar3;
          this[1].begin = (Lexeme *)local_48;
          this[1].end = (Lexeme *)pSStack_40;
        }
      }
    }
    if (this == (SynBase *)0x0) {
      this = ParseAssignment(ctx);
    }
    if (this == (SynBase *)0x0) {
      anon_unknown.dwarf_15703::Report
                (ctx,ctx->currentLexeme,"ERROR: condition not found in \'if\' statement");
      iVar2 = (*ctx->allocator->_vptr_Allocator[2])();
      this = (SynBase *)CONCAT44(extraout_var_00,iVar2);
      SynBase::SynBase(this,0,ctx->currentLexeme,ctx->currentLexeme);
      this->_vptr_SynBase = (_func_int **)&PTR__SynBase_002471e8;
    }
    anon_unknown.dwarf_15703::CheckConsume
              (ctx,lex_cparen,"ERROR: closing \')\' not found after \'if\' condition");
    pSVar3 = ParseExpression(ctx);
    if (pSVar3 == (SynBase *)0x0) {
      anon_unknown.dwarf_15703::Report
                (ctx,ctx->currentLexeme,"ERROR: expression not found after \'if\'");
      iVar2 = (*ctx->allocator->_vptr_Allocator[2])();
      pSVar3 = (SynBase *)CONCAT44(extraout_var_01,iVar2);
      SynBase::SynBase(pSVar3,0,ctx->currentLexeme,ctx->currentLexeme);
      pSVar3->_vptr_SynBase = (_func_int **)&PTR__SynBase_002471e8;
    }
    if ((forceStaticIf_00 != false) && (ctx->currentLexeme->type == lex_semicolon)) {
      ctx->currentLexeme = ctx->currentLexeme + 1;
    }
    pLVar1 = ctx->currentLexeme;
    if (pLVar1->type == lex_else) {
      ctx->currentLexeme = pLVar1 + 1;
      if (pLVar1[1].type == lex_if) {
        this_00 = ParseIfElse(ctx,forceStaticIf_00);
      }
      else {
        this_00 = (SynIfElse *)ParseExpression(ctx);
      }
      if (this_00 == (SynIfElse *)0x0) {
        anon_unknown.dwarf_15703::Report
                  (ctx,ctx->currentLexeme,"ERROR: expression not found after \'else\'");
        iVar2 = (*ctx->allocator->_vptr_Allocator[2])();
        this_00 = (SynIfElse *)CONCAT44(extraout_var_02,iVar2);
        SynBase::SynBase((SynBase *)this_00,0,ctx->currentLexeme,ctx->currentLexeme);
        (this_00->super_SynBase)._vptr_SynBase = (_func_int **)&PTR__SynBase_002471e8;
      }
      if ((forceStaticIf_00 != false) && (ctx->currentLexeme->type == lex_semicolon)) {
        ctx->currentLexeme = ctx->currentLexeme + 1;
      }
    }
    else {
      this_00 = (SynIfElse *)0x0;
    }
    iVar2 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x58);
    this_01 = (SynIfElse *)CONCAT44(extraout_var_03,iVar2);
    if (ctx->currentLexeme <= ctx->firstLexeme) {
LAB_001196be:
      __assert_fail("currentLexeme > firstLexeme",
                    "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/ParseTree.cpp"
                    ,0x19c,"Lexeme *ParseContext::Previous()");
    }
    SynBase::SynBase((SynBase *)this_01,0x27,begin,ctx->currentLexeme + -1);
    (this_01->super_SynBase)._vptr_SynBase = (_func_int **)&PTR__SynBase_00247b50;
    (this_01->super_SynBase).field_0x3a = forceStaticIf_00;
    this_01->condition = this;
    this_01->trueBlock = pSVar3;
    this_01->falseBlock = &this_00->super_SynBase;
  }
  else {
    if (forceStaticIf_00 != false) {
      ctx->currentLexeme = begin;
    }
    this_01 = (SynIfElse *)0x0;
  }
  return this_01;
}

Assistant:

SynIfElse* ParseIfElse(ParseContext &ctx, bool forceStaticIf)
{
	Lexeme *start = ctx.currentLexeme;

	bool staticIf = forceStaticIf || ctx.Consume(lex_at);

	if(ctx.Consume(lex_if))
	{
		CheckConsume(ctx, lex_oparen, "ERROR: '(' not found after 'if'");

		Lexeme *conditionPos = ctx.currentLexeme;

		SynBase *condition = NULL;

		if(!staticIf)
		{
			if(SynBase *type = ParseType(ctx))
			{
				IntrusiveList<SynVariableDefinition> definitions;

				if(SynVariableDefinition *definition = ParseVariableDefinition(ctx))
				{
					definitions.push_back(definition);

					condition = new (ctx.get<SynVariableDefinitions>()) SynVariableDefinitions(start, ctx.Previous(), NULL, type, definitions);
				}
				else
				{
					ctx.currentLexeme = conditionPos;
				}
			}
		}

		if(!condition)
			condition = ParseAssignment(ctx);

		if(!condition)
		{
			Report(ctx, ctx.Current(), "ERROR: condition not found in 'if' statement");

			condition = new (ctx.get<SynError>()) SynError(ctx.Current(), ctx.Current());
		}

		CheckConsume(ctx, lex_cparen, "ERROR: closing ')' not found after 'if' condition");

		SynBase *trueBlock = ParseExpression(ctx);

		if(!trueBlock)
		{
			Report(ctx, ctx.Current(), "ERROR: expression not found after 'if'");

			trueBlock = new (ctx.get<SynError>()) SynError(ctx.Current(), ctx.Current());
		}

		SynBase *falseBlock = NULL;

		if(staticIf && ctx.At(lex_semicolon))
			ctx.Skip();

		if(ctx.Consume(lex_else))
		{
			if(ctx.At(lex_if))
				falseBlock = ParseIfElse(ctx, staticIf);
			else
				falseBlock = ParseExpression(ctx);

			if(!falseBlock)
			{
				Report(ctx, ctx.Current(), "ERROR: expression not found after 'else'");

				falseBlock = new (ctx.get<SynError>()) SynError(ctx.Current(), ctx.Current());
			}

			if(staticIf && ctx.At(lex_semicolon))
				ctx.Skip();
		}

		return new (ctx.get<SynIfElse>()) SynIfElse(start, ctx.Previous(), staticIf, condition, trueBlock, falseBlock);
	}

	if(staticIf)
	{
		// Backtrack
		ctx.currentLexeme = start;
	}

	return NULL;
}